

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O1

void Abc_WriteMulti(FILE *pFile,int nVars)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar11 = (ulong)(uint)nVars;
  if (1 < (uint)nVars) {
    uVar11 = 0;
    uVar2 = nVars - 1;
    if (uVar2 != 0) {
      do {
        uVar11 = (ulong)((int)uVar11 + 1);
        bVar1 = 9 < uVar2;
        uVar2 = uVar2 / 10;
      } while (bVar1);
    }
  }
  uVar2 = nVars * 2;
  uVar10 = (ulong)uVar2;
  if (nVars != 0) {
    uVar10 = 0;
    uVar5 = uVar2 - 1;
    do {
      uVar10 = (ulong)((int)uVar10 + 1);
      bVar1 = 9 < uVar5;
      uVar5 = uVar5 / 10;
    } while (bVar1);
  }
  if (nVars < 1) {
    __assert_fail("nVars > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                  ,0x90,"void Abc_WriteMulti(FILE *, int)");
  }
  fprintf((FILE *)pFile,".model Multi%d\n",(ulong)(uint)nVars);
  fwrite(".inputs",7,1,(FILE *)pFile);
  uVar8 = 0;
  do {
    fprintf((FILE *)pFile," a%0*d",uVar11,uVar8);
    uVar5 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar5;
  } while (nVars != uVar5);
  uVar5 = 0;
  do {
    fprintf((FILE *)pFile," b%0*d",uVar11,(ulong)uVar5);
    uVar5 = uVar5 + 1;
  } while (nVars != uVar5);
  fputc(10,(FILE *)pFile);
  fwrite(".outputs",8,1,(FILE *)pFile);
  uVar5 = 1;
  if (1 < (int)uVar2) {
    uVar5 = uVar2;
  }
  uVar6 = 0;
  do {
    fprintf((FILE *)pFile," m%0*d",uVar10,(ulong)uVar6);
    uVar6 = uVar6 + 1;
  } while (uVar5 != uVar6);
  fputc(10,(FILE *)pFile);
  uVar6 = 0;
  do {
    fprintf((FILE *)pFile,".names x%0*d_%0*d\n",uVar11,0,uVar10,(ulong)uVar6);
    uVar6 = uVar6 + 1;
  } while (uVar5 != uVar6);
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = uVar2;
  }
  uVar4 = 1;
  if (1 < nVars) {
    uVar4 = nVars;
  }
  iVar3 = 0;
  uVar8 = 0;
  do {
    uVar7 = (uint)uVar8;
    uVar9 = 0;
    do {
      uVar12 = (uint)uVar9;
      if ((int)uVar12 < (int)(nVars + uVar7) && uVar7 <= uVar12) {
        fprintf((FILE *)pFile,".names b%0*d a%0*d y%0*d_%0*d\n11 1\n",uVar11,uVar8,uVar11,
                (ulong)(iVar3 + uVar12),uVar11,uVar8,uVar10,uVar9);
      }
      else {
        fprintf((FILE *)pFile,".names y%0*d_%0*d\n",uVar11,uVar8,uVar10,uVar9);
      }
      uVar9 = (ulong)(uVar12 + 1);
    } while (uVar5 != uVar12 + 1);
    uVar9 = 0;
    fprintf((FILE *)pFile,".subckt ADD%d",(ulong)uVar2);
    do {
      fprintf((FILE *)pFile," a%0*d=x%0*d_%0*d",uVar10,uVar9,uVar11,uVar8,uVar10,uVar9);
      uVar12 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar12;
    } while (uVar5 != uVar12);
    uVar9 = 0;
    do {
      fprintf((FILE *)pFile," b%0*d=y%0*d_%0*d",uVar10,uVar9,uVar11,uVar8,uVar10,uVar9);
      uVar12 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar12;
    } while (uVar5 != uVar12);
    uVar7 = uVar7 + 1;
    uVar8 = (ulong)uVar7;
    uVar9 = 0;
    do {
      fprintf((FILE *)pFile," s%0*d=x%0*d_%0*d",uVar10,uVar9,uVar11,(ulong)uVar7,uVar10,uVar9);
      uVar12 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar12;
    } while (uVar6 + 1 != uVar12);
    fputc(10,(FILE *)pFile);
    iVar3 = iVar3 + -1;
  } while (uVar7 != uVar4);
  uVar5 = 1;
  if (1 < (int)uVar2) {
    uVar5 = uVar2;
  }
  uVar9 = 0;
  do {
    fprintf((FILE *)pFile,".names x%0*d_%0*d m%0*d\n1 1\n",uVar11,uVar8,uVar10,uVar9,uVar10,uVar9);
    uVar6 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar6;
  } while (uVar5 != uVar6);
  fwrite(".end\n",5,1,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  Abc_WriteAdder(pFile,uVar2);
  return;
}

Assistant:

void Abc_WriteMulti( FILE * pFile, int nVars )
{
    int i, k, nDigits = Abc_Base10Log( nVars ), nDigits2 = Abc_Base10Log( 2*nVars );

    assert( nVars > 0 );
    fprintf( pFile, ".model Multi%d\n", nVars );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " a%0*d", nDigits, i );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " b%0*d", nDigits, i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    for ( i = 0; i < 2*nVars; i++ )
        fprintf( pFile, " m%0*d", nDigits2, i );
    fprintf( pFile, "\n" );

    for ( i = 0; i < 2*nVars; i++ )
        fprintf( pFile, ".names x%0*d_%0*d\n", nDigits, 0, nDigits2, i );
    for ( k = 0; k < nVars; k++ )
    {
        for ( i = 0; i < 2 * nVars; i++ )
            if ( i >= k && i < k + nVars )
                fprintf( pFile, ".names b%0*d a%0*d y%0*d_%0*d\n11 1\n", nDigits, k, nDigits, i-k, nDigits, k, nDigits2, i );
            else
                fprintf( pFile, ".names y%0*d_%0*d\n", nDigits, k, nDigits2, i );
        fprintf( pFile, ".subckt ADD%d", 2*nVars );
        for ( i = 0; i < 2*nVars; i++ )
            fprintf( pFile, " a%0*d=x%0*d_%0*d", nDigits2, i, nDigits, k, nDigits2, i );
        for ( i = 0; i < 2*nVars; i++ )
            fprintf( pFile, " b%0*d=y%0*d_%0*d", nDigits2, i, nDigits, k, nDigits2, i );
        for ( i = 0; i <= 2*nVars; i++ )
            fprintf( pFile, " s%0*d=x%0*d_%0*d", nDigits2, i, nDigits, k+1, nDigits2, i );
        fprintf( pFile, "\n" );
    }
    for ( i = 0; i < 2 * nVars; i++ )
        fprintf( pFile, ".names x%0*d_%0*d m%0*d\n1 1\n", nDigits, k, nDigits2, i, nDigits2, i );
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );
    Abc_WriteAdder( pFile, 2*nVars );
}